

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softhsm2-util-ossl.cpp
# Opt level: O2

dsa_key_material_t * crypto_malloc_dsa(DSA *dsa)

{
  int iVar1;
  dsa_key_material_t *keyMat;
  uchar *to;
  uchar *to_00;
  uchar *to_01;
  uchar *to_02;
  uchar *to_03;
  size_t __size;
  size_t __size_00;
  size_t __size_01;
  size_t __size_02;
  size_t __size_03;
  BIGNUM *bn_pub_key;
  BIGNUM *bn_priv_key;
  BIGNUM *bn_g;
  BIGNUM *bn_q;
  BIGNUM *bn_p;
  
  if ((dsa != (DSA *)0x0) &&
     (keyMat = (dsa_key_material_t *)malloc(0x50), keyMat != (dsa_key_material_t *)0x0)) {
    bn_p = (BIGNUM *)0x0;
    bn_q = (BIGNUM *)0x0;
    bn_g = (BIGNUM *)0x0;
    bn_priv_key = (BIGNUM *)0x0;
    bn_pub_key = (BIGNUM *)0x0;
    DSA_get0_pqg(dsa,&bn_p,&bn_q,&bn_g);
    DSA_get0_key(dsa,&bn_pub_key,&bn_priv_key);
    iVar1 = BN_num_bits((BIGNUM *)bn_p);
    __size_02 = (size_t)((iVar1 + 7) / 8);
    *(size_t *)keyMat = __size_02;
    iVar1 = BN_num_bits((BIGNUM *)bn_q);
    __size_03 = (size_t)((iVar1 + 7) / 8);
    *(size_t *)(keyMat + 8) = __size_03;
    iVar1 = BN_num_bits((BIGNUM *)bn_g);
    __size = (size_t)((iVar1 + 7) / 8);
    *(size_t *)(keyMat + 0x10) = __size;
    iVar1 = BN_num_bits((BIGNUM *)bn_priv_key);
    __size_00 = (size_t)((iVar1 + 7) / 8);
    *(size_t *)(keyMat + 0x18) = __size_00;
    iVar1 = BN_num_bits((BIGNUM *)bn_pub_key);
    __size_01 = (size_t)((iVar1 + 7) / 8);
    *(size_t *)(keyMat + 0x20) = __size_01;
    to = (uchar *)malloc(__size_02);
    *(uchar **)(keyMat + 0x28) = to;
    to_00 = (uchar *)malloc(__size_03);
    *(uchar **)(keyMat + 0x30) = to_00;
    to_01 = (uchar *)malloc(__size);
    *(uchar **)(keyMat + 0x38) = to_01;
    to_02 = (uchar *)malloc(__size_00);
    *(uchar **)(keyMat + 0x40) = to_02;
    to_03 = (uchar *)malloc(__size_01);
    *(uchar **)(keyMat + 0x48) = to_03;
    if (((to != (uchar *)0x0) &&
        (((to_00 != (uchar *)0x0 && (to_01 != (uchar *)0x0)) && (to_02 != (uchar *)0x0)))) &&
       (to_03 != (uchar *)0x0)) {
      BN_bn2bin((BIGNUM *)bn_p,to);
      BN_bn2bin((BIGNUM *)bn_q,to_00);
      BN_bn2bin((BIGNUM *)bn_g,to_01);
      BN_bn2bin((BIGNUM *)bn_priv_key,to_02);
      BN_bn2bin((BIGNUM *)bn_pub_key,to_03);
      return keyMat;
    }
    crypto_free_dsa(keyMat);
  }
  return (dsa_key_material_t *)0x0;
}

Assistant:

dsa_key_material_t* crypto_malloc_dsa(DSA* dsa)
{
	if (dsa == NULL)
	{
		return NULL;
	}

	dsa_key_material_t* keyMat = (dsa_key_material_t*)malloc(sizeof(dsa_key_material_t));
	if (keyMat == NULL)
	{
		return NULL;
	}

	const BIGNUM* bn_p = NULL;
	const BIGNUM* bn_q = NULL;
	const BIGNUM* bn_g = NULL;
	const BIGNUM* bn_priv_key = NULL;
	const BIGNUM* bn_pub_key = NULL;
	DSA_get0_pqg(dsa, &bn_p, &bn_q, &bn_g);
	DSA_get0_key(dsa, &bn_pub_key, &bn_priv_key);

	keyMat->sizeP = BN_num_bytes(bn_p);
	keyMat->sizeQ = BN_num_bytes(bn_q);
	keyMat->sizeG = BN_num_bytes(bn_g);
	keyMat->sizeX = BN_num_bytes(bn_priv_key);
	keyMat->sizeY = BN_num_bytes(bn_pub_key);

	keyMat->bigP = (CK_VOID_PTR)malloc(keyMat->sizeP);
	keyMat->bigQ = (CK_VOID_PTR)malloc(keyMat->sizeQ);
	keyMat->bigG = (CK_VOID_PTR)malloc(keyMat->sizeG);
	keyMat->bigX = (CK_VOID_PTR)malloc(keyMat->sizeX);
	keyMat->bigY = (CK_VOID_PTR)malloc(keyMat->sizeY);

	if (!keyMat->bigP || !keyMat->bigQ || !keyMat->bigG || !keyMat->bigX || !keyMat->bigY)
	{
		crypto_free_dsa(keyMat);
		return NULL;
	}

	BN_bn2bin(bn_p, (unsigned char*)keyMat->bigP);
	BN_bn2bin(bn_q, (unsigned char*)keyMat->bigQ);
	BN_bn2bin(bn_g, (unsigned char*)keyMat->bigG);
	BN_bn2bin(bn_priv_key, (unsigned char*)keyMat->bigX);
	BN_bn2bin(bn_pub_key, (unsigned char*)keyMat->bigY);

	return keyMat;
}